

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall GraphTest_SimpleSquare_Test::TestBody(GraphTest_SimpleSquare_Test *this)

{
  graph lat;
  
  lattice::graph::simple(&lat,2,4);
  lattice::graph::print(&lat,(ostream *)&std::cout);
  check(&lat);
  lattice::graph::~graph(&lat);
  return;
}

Assistant:

TEST(GraphTest, SimpleSquare) {
  graph lat = graph::simple(2, 4);
  lat.print(std::cout);
  check(lat);
}